

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

U32 ZSTD_window_update(ZSTD_window_t *window,void *src,size_t srcSize,int forceNonContiguous)

{
  ulong uVar1;
  long lVar2;
  int in_ECX;
  long in_RDX;
  ulong in_RSI;
  ulong *in_RDI;
  U32 lowLimitMax;
  ptrdiff_t highInputIdx;
  size_t distanceFromBase;
  U32 contiguous;
  BYTE *ip;
  undefined4 local_50;
  U32 local_34;
  U32 local_4;
  
  local_34 = 1;
  if (in_RDX == 0) {
    local_4 = 1;
  }
  else {
    if (in_RDI[1] == 0) {
      __assert_fail("window->base != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x48d8,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t, int)");
    }
    if (in_RDI[2] == 0) {
      __assert_fail("window->dictBase != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x48d9,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t, int)");
    }
    if ((in_RSI != *in_RDI) || (in_ECX != 0)) {
      uVar1 = *in_RDI - in_RDI[1];
      *(int *)((long)in_RDI + 0x1c) = (int)in_RDI[3];
      if (uVar1 != (uVar1 & 0xffffffff)) {
        __assert_fail("distanceFromBase == (size_t)(U32)distanceFromBase",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x48e0,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t, int)");
      }
      *(int *)(in_RDI + 3) = (int)uVar1;
      in_RDI[2] = in_RDI[1];
      in_RDI[1] = in_RSI - uVar1;
      if ((uint)((int)in_RDI[3] - *(int *)((long)in_RDI + 0x1c)) < 8) {
        *(int *)((long)in_RDI + 0x1c) = (int)in_RDI[3];
      }
      local_34 = 0;
    }
    *in_RDI = in_RSI + in_RDX;
    if (in_RDI[2] + (ulong)*(uint *)((long)in_RDI + 0x1c) < in_RSI + in_RDX &&
        in_RSI < in_RDI[2] + (ulong)(uint)in_RDI[3]) {
      lVar2 = (in_RSI + in_RDX) - in_RDI[2];
      if ((long)(ulong)(uint)in_RDI[3] < lVar2) {
        local_50 = (undefined4)in_RDI[3];
      }
      else {
        local_50 = (undefined4)lVar2;
      }
      *(undefined4 *)((long)in_RDI + 0x1c) = local_50;
    }
    local_4 = local_34;
  }
  return local_4;
}

Assistant:

MEM_STATIC U32 ZSTD_window_update(ZSTD_window_t* window,
                                  void const* src, size_t srcSize,
                                  int forceNonContiguous)
{
    BYTE const* const ip = (BYTE const*)src;
    U32 contiguous = 1;
    DEBUGLOG(5, "ZSTD_window_update");
    if (srcSize == 0)
        return contiguous;
    assert(window->base != NULL);
    assert(window->dictBase != NULL);
    /* Check if blocks follow each other */
    if (src != window->nextSrc || forceNonContiguous) {
        /* not contiguous */
        size_t const distanceFromBase = (size_t)(window->nextSrc - window->base);
        DEBUGLOG(5, "Non contiguous blocks, new segment starts at %u", window->dictLimit);
        window->lowLimit = window->dictLimit;
        assert(distanceFromBase == (size_t)(U32)distanceFromBase);  /* should never overflow */
        window->dictLimit = (U32)distanceFromBase;
        window->dictBase = window->base;
        window->base = ip - distanceFromBase;
        /* ms->nextToUpdate = window->dictLimit; */
        if (window->dictLimit - window->lowLimit < HASH_READ_SIZE) window->lowLimit = window->dictLimit;   /* too small extDict */
        contiguous = 0;
    }
    window->nextSrc = ip + srcSize;
    /* if input and dictionary overlap : reduce dictionary (area presumed modified by input) */
    if ( (ip+srcSize > window->dictBase + window->lowLimit)
       & (ip < window->dictBase + window->dictLimit)) {
        ptrdiff_t const highInputIdx = (ip + srcSize) - window->dictBase;
        U32 const lowLimitMax = (highInputIdx > (ptrdiff_t)window->dictLimit) ? window->dictLimit : (U32)highInputIdx;
        window->lowLimit = lowLimitMax;
        DEBUGLOG(5, "Overlapping extDict and input : new lowLimit = %u", window->lowLimit);
    }
    return contiguous;
}